

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

Snapshot * __thiscall
cmState::CreateInlineListFileSnapshot
          (Snapshot *__return_storage_ptr__,cmState *this,Snapshot originSnapshot,
          string *entryPointCommand,long entryPointLine,string *fileName)

{
  PositionType PVar1;
  PositionType it;
  ReferenceType pSVar2;
  PointerType pSVar3;
  PointerType pBVar4;
  PointerType pSVar5;
  iterator iVar6;
  PositionType pos;
  iterator local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  undefined1 local_118 [232];
  
  it = originSnapshot.Position;
  pSVar2 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator*(&originSnapshot.Position);
  SnapshotDataType::SnapshotDataType((SnapshotDataType *)local_118,pSVar2);
  local_148 = cmLinkedTree<cmState::SnapshotDataType>::Push
                        (&this->SnapshotData,it,(SnapshotDataType *)local_118);
  std::__cxx11::string::~string((string *)(local_118 + 0xa8));
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  pSVar3->EntryPointLine = entryPointLine;
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  std::__cxx11::string::_M_assign((string *)&pSVar3->EntryPointCommand);
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  pSVar3->SnapshotType = InlineListFileType;
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  pSVar3->Keep = true;
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  iVar6 = pSVar3->ExecutionListFile;
  std::__cxx11::string::string((string *)&local_138,(string *)fileName);
  iVar6 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::Push(&this->ExecutionListFiles,iVar6,&local_138);
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  pSVar3->ExecutionListFile = iVar6;
  std::__cxx11::string::~string((string *)&local_138);
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  pBVar4 = cmLinkedTree<cmState::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  (pBVar4->DirectoryEnd).Tree = local_148.Tree;
  (pBVar4->DirectoryEnd).Position = local_148.Position;
  pSVar3 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&originSnapshot.Position);
  pSVar5 = cmLinkedTree<cmState::SnapshotDataType>::iterator::operator->(&local_148);
  PVar1 = (pSVar3->Policies).Position;
  (pSVar5->PolicyScope).Tree = (pSVar3->Policies).Tree;
  (pSVar5->PolicyScope).Position = PVar1;
  __return_storage_ptr__->State = this;
  (__return_storage_ptr__->Position).Tree = local_148.Tree;
  (__return_storage_ptr__->Position).Position = local_148.Position;
  return __return_storage_ptr__;
}

Assistant:

cmState::Snapshot
cmState::CreateInlineListFileSnapshot(cmState::Snapshot originSnapshot,
                                      const std::string& entryPointCommand,
                                      long entryPointLine,
                                      const std::string& fileName)
{
  PositionType pos = this->SnapshotData.Push(originSnapshot.Position,
                                             *originSnapshot.Position);
  pos->EntryPointLine = entryPointLine;
  pos->EntryPointCommand = entryPointCommand;
  pos->SnapshotType = InlineListFileType;
  pos->Keep = true;
  pos->ExecutionListFile = this->ExecutionListFiles.Push(
        originSnapshot.Position->ExecutionListFile, fileName);
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->PolicyScope = originSnapshot.Position->Policies;
  return cmState::Snapshot(this, pos);
}